

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

char * libtorrent::parse_int(char *start,char *end,char delimiter,int64_t *val,error_code_enum *ec)

{
  long lVar1;
  int64_t iVar2;
  error_code_enum eVar3;
  long lVar4;
  
  iVar2 = *val;
  eVar3 = expected_digit;
  while( true ) {
    if (end <= start) {
      return start;
    }
    if (*start == delimiter) {
      return start;
    }
    if (9 < (byte)(*start - 0x30U)) goto LAB_001891c5;
    if (0xccccccccccccccc < iVar2) break;
    lVar1 = iVar2 * 10;
    *val = lVar1;
    lVar4 = -0x7fffffffffffffd1 - (long)*start;
    if (lVar1 - lVar4 != 0 && lVar4 <= lVar1) break;
    iVar2 = lVar1 + *start + -0x30;
    *val = iVar2;
    start = start + 1;
  }
  eVar3 = overflow;
LAB_001891c5:
  *ec = eVar3;
  return start;
}

Assistant:

char const* parse_int(char const* start, char const* end, char delimiter
		, std::int64_t& val, bdecode_errors::error_code_enum& ec)
	{
		while (start < end && *start != delimiter)
		{
			if (!numeric(*start))
			{
				ec = bdecode_errors::expected_digit;
				return start;
			}
			if (val > std::numeric_limits<std::int64_t>::max() / 10)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val *= 10;
			int digit = *start - '0';
			if (val > std::numeric_limits<std::int64_t>::max() - digit)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val += digit;
			++start;
		}
		return start;
	}